

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

String * __thiscall
capnp::anon_unknown_79::Parser::consumeNumber(String *__return_storage_ptr__,Parser *this)

{
  size_t sVar1;
  Array<char> local_88;
  char local_69;
  undefined1 local_68 [8];
  Vector<char> number;
  Fault local_38;
  Fault f;
  undefined1 local_28 [8];
  ArrayPtr<const_char> numArrayPtr;
  Parser *this_local;
  
  numArrayPtr.size_ = (size_t)this;
  _local_28 = (anonymous_namespace)::Input::
              consumeCustom<capnp::(anonymous_namespace)::Parser::consumeNumber()::_lambda(capnp::(anonymous_namespace)::Input&)_1_>
                        ((Input *)&this->input,(anon_class_1_0_00000001 *)((long)&f.exception + 7));
  sVar1 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_28);
  if (sVar1 != 0) {
    kj::Vector<char>::Vector((Vector<char> *)local_68);
    kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>
              ((Vector<char> *)local_68,(ArrayPtr<const_char> *)local_28);
    local_69 = '\0';
    kj::Vector<char>::add<char>((Vector<char> *)local_68,&local_69);
    kj::Vector<char>::releaseAsArray(&local_88,(Vector<char> *)local_68);
    kj::String::String(__return_storage_ptr__,&local_88);
    kj::Array<char>::~Array(&local_88);
    kj::Vector<char>::~Vector((Vector<char> *)local_68);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x321,FAILED,"numArrayPtr.size() > 0","\"Expected number in JSON input.\"",
             (char (*) [31])"Expected number in JSON input.");
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

kj::String consumeNumber() {
    auto numArrayPtr = input.consumeCustom([](Input& input) {
      input.tryConsume('-');
      if (!input.tryConsume('0')) {
        input.consumeOne([](char c) { return '1' <= c && c <= '9'; });
        input.consumeWhile([](char c) { return '0' <= c && c <= '9'; });
      }

      if (input.tryConsume('.')) {
        input.consumeWhile([](char c) { return '0' <= c && c <= '9'; });
      }

      if (input.tryConsume('e') || input.tryConsume('E')) {
        input.tryConsume('+') || input.tryConsume('-');
        input.consumeWhile([](char c) { return '0' <= c && c <= '9'; });
      }
    });

    KJ_REQUIRE(numArrayPtr.size() > 0, "Expected number in JSON input.");

    kj::Vector<char> number;
    number.addAll(numArrayPtr);
    number.add('\0');

    return kj::String(number.releaseAsArray());
  }